

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool __thiscall
ctemplate::TemplateCache::TemplateIsCached(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  int iVar1;
  Mutex *pMVar2;
  const_iterator cVar3;
  key_type local_18;
  
  local_18.first = template_cache_key.first;
  local_18.second = template_cache_key.second;
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + 1;
  if (iVar1 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  cVar3 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parsed_template_cache_->_M_h,&local_18);
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + -1;
  if (0 < iVar1) {
    return cVar3.
           super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
           ._M_cur != (__node_type *)0x0;
  }
  __assert_fail("mutex_-- > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xf0,"void ctemplate::Mutex::ReaderUnlock()");
}

Assistant:

bool TemplateCache::TemplateIsCached(const TemplateCacheKey template_cache_key)
    const {
  ReaderMutexLock ml(mutex_);
  return parsed_template_cache_->count(template_cache_key);
}